

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-powerpc.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__filename;
  bool bVar1;
  int iVar2;
  powerpc_test_cpu *this;
  bool ok;
  char *file;
  char *arg;
  powerpc_test_cpu *ppc;
  FILE *fp;
  char **argv_local;
  int argc_local;
  
  ppc = (powerpc_test_cpu *)0x0;
  this = (powerpc_test_cpu *)operator_new(0x248);
  powerpc_test_cpu::powerpc_test_cpu(this);
  fp = (FILE *)argv;
  argv_local._0_4_ = argc;
  if ((1 < argc) && (iVar2 = strcmp(argv[1],"--jit"), iVar2 == 0)) {
    argv_local._0_4_ = argc + -1;
    argv[1] = *argv;
    fp = (FILE *)(argv + 1);
    powerpc_cpu_base::enable_jit((powerpc_cpu_base *)this);
  }
  if (1 < (int)argv_local) {
    __filename = *(char **)(fp + 8);
    ppc = (powerpc_test_cpu *)fopen(__filename,"rb");
    if (ppc == (powerpc_test_cpu *)0x0) {
      fprintf(_stderr,"ERROR: can\'t open %s for reading\n",__filename);
      return 1;
    }
    powerpc_test_cpu::set_results_file(this,(FILE *)ppc);
    setvbuf((FILE *)ppc,main::buffer,0,0x1000);
  }
  if (ppc == (powerpc_test_cpu *)0x0) {
    fprintf(_stderr,"ERROR: a results file for reference is required\n");
    argv_local._4_4_ = 1;
  }
  else {
    has_altivec = true;
    bVar1 = powerpc_test_cpu::test(this);
    if (ppc != (powerpc_test_cpu *)0x0) {
      fclose((FILE *)ppc);
    }
    if (this != (powerpc_test_cpu *)0x0) {
      powerpc_test_cpu::~powerpc_test_cpu(this);
      operator_delete(this,0x248);
    }
    argv_local._4_4_ = (uint)((bVar1 ^ 0xffU) & 1);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
#ifdef EMU_KHEPERIX
	// Initialize VM system (predecode cache uses vm_acquire())
	vm_init();
#endif

	FILE *fp = NULL;
	powerpc_test_cpu *ppc = new powerpc_test_cpu;

	if (argc > 1) {
		const char *arg = argv[1];
		if (strcmp(arg, "--jit") == 0) {
			--argc;
			argv[1] = argv[0];
			++argv;
			ppc->enable_jit();
		}
	}

	if (argc > 1) {
		const char *file = argv[1];
#ifdef NATIVE_POWERPC
		if ((fp = fopen(file, "wb")) == NULL) {
			fprintf(stderr, "ERROR: can't open %s for writing\n", file);
			return EXIT_FAILURE;
		}
#else
		if ((fp = fopen(file, "rb")) == NULL) {
			fprintf(stderr, "ERROR: can't open %s for reading\n", file);
			return EXIT_FAILURE;
		}
#endif
		ppc->set_results_file(fp);

		// Use a large enough buffer
		static char buffer[4096];
		setvbuf(fp, buffer, _IOFBF, sizeof(buffer));
	}

	// We need a results file on non PowerPC platforms
#ifndef NATIVE_POWERPC
	if (fp == NULL) {
		fprintf(stderr, "ERROR: a results file for reference is required\n");
		return EXIT_FAILURE;
	}
#endif

	// Check if host CPU supports AltiVec instructions
	has_altivec = true;
#ifdef NATIVE_POWERPC
	signal(SIGILL, sigill_handler);
	if (!sigsetjmp(env, 1))
		asm volatile(".long 0x10000484"); // vor v0,v0,v0
	signal(SIGILL, SIG_DFL);
#endif

	bool ok = ppc->test();
	if (fp) fclose(fp);
	delete ppc;
	return !ok;
}